

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

void __thiscall
Catch::RunContext::testGroupStarting
          (RunContext *this,string *testSpec,size_t groupIndex,size_t groupsCount)

{
  IStreamingReporter *pIVar1;
  pointer pcVar2;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  size_t local_38;
  size_t local_30;
  
  pIVar1 = (this->m_reporter)._M_t.
           super___uniq_ptr_impl<Catch::IStreamingReporter,_std::default_delete<Catch::IStreamingReporter>_>
           ._M_t.
           super__Tuple_impl<0UL,_Catch::IStreamingReporter_*,_std::default_delete<Catch::IStreamingReporter>_>
           .super__Head_base<0UL,_Catch::IStreamingReporter_*,_false>._M_head_impl;
  pcVar2 = (testSpec->_M_dataplus)._M_p;
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_58,pcVar2,pcVar2 + testSpec->_M_string_length);
  local_38 = groupIndex;
  local_30 = groupsCount;
  (*pIVar1->_vptr_IStreamingReporter[5])(pIVar1,local_58);
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  return;
}

Assistant:

void RunContext::testGroupStarting(std::string const& testSpec, std::size_t groupIndex, std::size_t groupsCount) {
        m_reporter->testGroupStarting(GroupInfo(testSpec, groupIndex, groupsCount));
    }